

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader-libcurl.cpp
# Opt level: O0

size_t Downloader_libcurl::fetchDownloadedData(char *ptr,size_t size,size_t nmemb,void *stream)

{
  void *pvVar1;
  memBlockStruc *mem;
  void *stream_local;
  size_t nmemb_local;
  size_t size_local;
  char *ptr_local;
  
  if (*(long *)((long)stream + 8) == 0) {
    pvVar1 = malloc((long)*(int *)((long)stream + 4));
    *(void **)((long)stream + 8) = pvVar1;
  }
  if (*(long *)((long)stream + 8) == 0) {
    ptr_local = (char *)0xffffffffffffffff;
  }
  else {
    while ((ulong)(long)*(int *)((long)stream + 4) < (long)*stream + size * nmemb) {
      *(int *)((long)stream + 4) = *(int *)((long)stream + 4) << 1;
      pvVar1 = realloc(*(void **)((long)stream + 8),(long)*(int *)((long)stream + 4));
      *(void **)((long)stream + 8) = pvVar1;
    }
    memcpy((void *)(*(long *)((long)stream + 8) + (long)*stream),ptr,size * nmemb);
    *(int *)stream = *stream + (int)size * (int)nmemb;
    ptr_local = (char *)(size * nmemb);
  }
  return (size_t)ptr_local;
}

Assistant:

size_t Downloader_libcurl::fetchDownloadedData(char *ptr, size_t size, size_t nmemb, void *stream)
{
    auto *mem = (memBlockStruc *)stream;

    if(mem->memBlock == nullptr) mem->memBlock = (char *)malloc(mem->allocSize);
    if(mem->memBlock == nullptr) return -1;
    while(mem->realSize + size * nmemb > mem->allocSize)
    {
        mem->allocSize <<= 1;
        mem->memBlock = (char *)realloc(mem->memBlock, mem->allocSize);
    }

    memcpy(&(mem->memBlock[mem->realSize]), ptr, size * nmemb);
    mem->realSize += size * nmemb;
    return size * nmemb;
}